

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.hh
# Opt level: O3

shared_ptr<kratos::PackedStruct> __thiscall
kratos::PortPackedStruct::packed_struct(PortPackedStruct *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<kratos::PackedStruct> sVar2;
  
  (in_RDI->struct_name)._M_dataplus._M_p =
       (pointer)(this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  p_Var1 = (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->struct_name)._M_string_length = (size_type)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<kratos::PackedStruct>)
         sVar2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<PackedStruct> packed_struct() const override { return struct_; }